

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O3

_Bool upb_DefPool_SetFeatureSetDefaults
                (upb_DefPool *s,char *serialized_defaults,size_t serialized_len,upb_Status *status)

{
  int iVar1;
  upb_Arena *a;
  anon_union_8_2_9eb4e620_for_upb_Message_0 aVar2;
  upb_DecodeStatus uVar3;
  char *pcVar4;
  google_protobuf_FeatureSetDefaults *msg;
  ulong uVar5;
  char *pcVar6;
  char *fmt;
  int iVar7;
  
  a = s->arena;
  msg = (google_protobuf_FeatureSetDefaults *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)msg) < 0x20) {
    msg = (google_protobuf_FeatureSetDefaults *)
          _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x20);
  }
  else {
    if ((google_protobuf_FeatureSetDefaults *)
        ((ulong)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != msg) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg + 4);
  }
  if (msg != (google_protobuf_FeatureSetDefaults *)0x0) {
    memset(msg,0,0x20);
    uVar3 = upb_Decode(serialized_defaults,serialized_len,
                       &msg->base_dont_copy_me__upb_internal_use_only,
                       &google__protobuf__FeatureSetDefaults_msg_init,(upb_ExtensionRegistry *)0x0,0
                       ,a);
    if (uVar3 == kUpb_DecodeStatus_Ok) {
      if ((s->files).t.count == 0) {
        iVar7 = *(int *)((long)&msg[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4);
        iVar1 = *(int *)&msg[2].base_dont_copy_me__upb_internal_use_only.field_0;
        if (iVar1 < iVar7) {
          pcVar6 = upb_FileDef_EditionName(iVar7);
          pcVar4 = upb_FileDef_EditionName(iVar1);
          fmt = "Invalid edition range %s to %s";
LAB_00111566:
          upb_Status_SetErrorFormat(status,fmt,pcVar6,pcVar4);
          return false;
        }
        aVar2 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg + 3))->internal_opaque;
        if ((aVar2 != (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) &&
           (*(ulong *)(aVar2.internal_opaque + 8) != 0)) {
          uVar5 = 0;
          iVar7 = 0;
          do {
            iVar1 = *(int *)(*(long *)((*(ulong *)aVar2 & 0xfffffffffffffff8) + uVar5 * 8) + 0xc);
            if (iVar1 == 0) {
              pcVar6 = "Invalid edition UNKNOWN specified";
              goto LAB_00111525;
            }
            if (iVar1 <= iVar7) {
              pcVar6 = upb_FileDef_EditionName(iVar7);
              pcVar4 = upb_FileDef_EditionName(iVar1);
              fmt = 
              "Feature set defaults are not strictly increasing, %s is greater than or equal to %s";
              goto LAB_00111566;
            }
            uVar5 = uVar5 + 1;
            iVar7 = iVar1;
          } while (*(ulong *)(aVar2.internal_opaque + 8) != uVar5);
        }
        s->feature_set_defaults = msg;
        return true;
      }
      pcVar6 = "Feature set defaults can\'t be changed once the pool has started building";
      goto LAB_00111525;
    }
  }
  pcVar6 = "Failed to parse defaults";
LAB_00111525:
  upb_Status_SetErrorFormat(status,pcVar6);
  return false;
}

Assistant:

bool upb_DefPool_SetFeatureSetDefaults(upb_DefPool* s,
                                       const char* serialized_defaults,
                                       size_t serialized_len,
                                       upb_Status* status) {
  const UPB_DESC(FeatureSetDefaults)* defaults = UPB_DESC(
      FeatureSetDefaults_parse)(serialized_defaults, serialized_len, s->arena);
  if (!defaults) {
    upb_Status_SetErrorFormat(status, "Failed to parse defaults");
    return false;
  }
  if (upb_strtable_count(&s->files) > 0) {
    upb_Status_SetErrorFormat(status,
                              "Feature set defaults can't be changed once the "
                              "pool has started building");
    return false;
  }
  int min_edition = UPB_DESC(FeatureSetDefaults_minimum_edition(defaults));
  int max_edition = UPB_DESC(FeatureSetDefaults_maximum_edition(defaults));
  if (min_edition > max_edition) {
    upb_Status_SetErrorFormat(status, "Invalid edition range %s to %s",
                              upb_FileDef_EditionName(min_edition),
                              upb_FileDef_EditionName(max_edition));
    return false;
  }
  size_t size;
  const UPB_DESC(
      FeatureSetDefaults_FeatureSetEditionDefault)* const* default_list =
      UPB_DESC(FeatureSetDefaults_defaults(defaults, &size));
  int prev_edition = UPB_DESC(EDITION_UNKNOWN);
  for (size_t i = 0; i < size; ++i) {
    int edition = UPB_DESC(
        FeatureSetDefaults_FeatureSetEditionDefault_edition(default_list[i]));
    if (edition == UPB_DESC(EDITION_UNKNOWN)) {
      upb_Status_SetErrorFormat(status, "Invalid edition UNKNOWN specified");
      return false;
    }
    if (edition <= prev_edition) {
      upb_Status_SetErrorFormat(status,
                                "Feature set defaults are not strictly "
                                "increasing, %s is greater than or equal to %s",
                                upb_FileDef_EditionName(prev_edition),
                                upb_FileDef_EditionName(edition));
      return false;
    }
    prev_edition = edition;
  }

  // Copy the defaults into the pool.
  s->feature_set_defaults = defaults;
  return true;
}